

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall
adios2sys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,vector<char_*,_std::allocator<char_*>_> *variable,
          string *value)

{
  char *var;
  char *local_20;
  
  local_20 = (char *)operator_new__(value->_M_string_length + 1);
  strcpy(local_20,(value->_M_dataplus)._M_p);
  std::vector<char_*,_std::allocator<char_*>_>::push_back(variable,&local_20);
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(std::vector<char*>* variable,
                                            const std::string& value)
{
  char* var = new char[value.size() + 1];
  strcpy(var, value.c_str());
  variable->push_back(var);
}